

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

bool __thiscall libchars::command_cursor::next(command_cursor *this)

{
  ulong uVar1;
  command_node *pcVar2;
  _Elt_pointer ppcVar3;
  _Elt_pointer ppcVar4;
  _Elt_pointer ppcVar5;
  size_type sVar6;
  ulong uVar7;
  bool bVar8;
  command_node *pcVar9;
  double __x;
  double in_XMM1_Qa;
  undefined1 local_58 [8];
  string rstr;
  command_node *n;
  
  pcVar2 = current(this);
  if (pcVar2 == (command_node *)0x0) {
    return false;
  }
  rstr.field_2._8_8_ = pcVar2;
  remainder_abi_cxx11_((command_cursor *)local_58,__x,in_XMM1_Qa);
  if (rstr._M_dataplus._M_p == (pointer)0x0) {
    if (pcVar2->head == (command_node *)0x0) {
      ppcVar3 = (this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppcVar4 = (this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      pcVar9 = pcVar2;
      while ((ppcVar4 != ppcVar3 && (pcVar2 != (command_node *)0x0))) {
        uVar7 = this->idx;
        if (pcVar2->next != (command_node *)0x0) goto LAB_0010f40b;
        if ((uVar7 != 0) && (uVar1 = (this->w)._M_string_length, uVar7 <= uVar1)) {
          std::__cxx11::string::erase((ulong)&this->w,uVar1 - uVar7);
        }
        std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>::pop_back
                  ((deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_> *)
                   this);
        ppcVar3 = (this->S).c.
                  super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
        ppcVar4 = (this->S).c.
                  super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (ppcVar4 == ppcVar3) {
          if (this->root == (command_node *)0x0) {
            sVar6 = 0;
          }
          else {
            uVar7 = (this->root->part)._M_string_length;
            sVar6 = 0;
            if (this->root_idx <= uVar7) {
              sVar6 = uVar7 - this->root_idx;
            }
          }
        }
        else {
          ppcVar5 = ppcVar4;
          if (ppcVar4 ==
              (this->S).c.
              super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppcVar5 = (this->S).c.
                      super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          rstr.field_2._8_8_ = ppcVar5[-1];
          if ((command_node *)rstr.field_2._8_8_ == (command_node *)0x0) {
            pcVar9 = (command_node *)0x0;
            pcVar2 = (command_node *)0x0;
            sVar6 = 0;
          }
          else {
            sVar6 = (((command_node *)rstr.field_2._8_8_)->part)._M_string_length;
            pcVar2 = (command_node *)rstr.field_2._8_8_;
            pcVar9 = (command_node *)rstr.field_2._8_8_;
          }
        }
        this->idx = sVar6;
      }
      uVar7 = this->idx;
LAB_0010f40b:
      if ((uVar7 != 0) && (uVar1 = (this->w)._M_string_length, uVar7 <= uVar1)) {
        std::__cxx11::string::erase((ulong)&this->w,uVar1 - uVar7);
        ppcVar3 = (this->S).c.
                  super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
        ppcVar4 = (this->S).c.
                  super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      }
      this->idx = 0;
      if ((ppcVar4 == ppcVar3) || (pcVar9 == (command_node *)0x0)) {
        (this->w)._M_string_length = 0;
        *(this->w)._M_dataplus._M_p = '\0';
      }
      else {
        pcVar2 = pcVar9->next;
        rstr.field_2._8_8_ = pcVar2;
        std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>::pop_back
                  ((deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_> *)
                   this);
        if (pcVar2 != (command_node *)0x0) {
          bVar8 = true;
          std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>::push_back
                    ((deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_> *)
                     this,(value_type *)((long)&rstr.field_2 + 8));
          goto LAB_0010f321;
        }
      }
      bVar8 = false;
      goto LAB_0010f321;
    }
    std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>::push_back
              ((deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_> *)this,
               &pcVar2->head);
    this->idx = 0;
  }
  else {
    std::__cxx11::string::append((string *)&this->w);
    this->idx = (size_t)(rstr._M_dataplus._M_p + this->idx);
  }
  bVar8 = true;
LAB_0010f321:
  std::__cxx11::string::~string((string *)local_58);
  return bVar8;
}

Assistant:

bool command_cursor::next()
    {
        // depth first search
        command_node *n = current();
        if (n == NULL)
            return false;

        /*
        if (S.empty())
            LC_LOG_VERBOSE("root[%p]@%zu; w[%s]",root,idx,w.c_str());
        else
            LC_LOG_VERBOSE("n[%p]@%zu; w[%s]",n,idx,w.c_str());
        */

        std::string rstr = remainder();
        if (!rstr.empty()) {
            //LC_LOG_VERBOSE("w + [%s]",rstr.c_str());
            w.append(rstr);
            idx += rstr.length();
            return true;
        }
        else if (n->head != NULL) {
            //LC_LOG_VERBOSE("push[%p;next=%p]",n->head,n->head->next);
            S.push(n->head);
            idx = 0;
            return true;
        }
        else {
            while (!S.empty() && n != NULL && n->next == NULL) {
                if (idx > 0 && idx <= w.length())
                    w.erase(w.length() - idx);

                //LC_LOG_VERBOSE("pop[%p;next=%p]",S.top(),S.top()->next);
                S.pop();

                if (S.empty()) {
                    if (root != NULL && root_idx < root->part.length())
                        idx = root->part.length() - root_idx;
                    else
                        idx = 0;
                }
                else {
                    if ((n = S.top()) != NULL)
                        idx = n->part.length();
                    else
                        idx = 0;
                }
            }

            if (idx > 0 && idx <= w.length())
                w.erase(w.length() - idx);

            idx = 0;
            if (S.empty() || n == NULL) {
                w.clear();
                return false;
            }

            n = n->next;
            //LC_LOG_VERBOSE("pop[%p;next=%p]",S.top(),S.top()->next);
            S.pop();

            if (n != NULL) {
                //LC_LOG_VERBOSE("push[%p;next=%p]",n,n->next);
                S.push(n);
                return true;
            }
        }
        return false;
    }